

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

void __thiscall
ON_BumpFunction::Evaluate(ON_BumpFunction *this,double s,double t,int der_count,double *value)

{
  double *value_00;
  double dt;
  double dt_00;
  double *value_01;
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ON_BumpFunction *this_00;
  double dVar5;
  double dVar6;
  double tmp [20];
  
  if (der_count < 10) {
    value_01 = tmp;
    this_00 = this;
  }
  else {
    this_00 = (ON_BumpFunction *)((ulong)(der_count * 2 + 2) << 3);
    value_01 = (double *)onmalloc((size_t)this_00);
  }
  dVar5 = s - this->m_x0;
  dt = this->m_sx[0.0 <= dVar5];
  dVar6 = t - this->m_y0;
  dVar5 = dVar5 * dt;
  dt_00 = this->m_sy[0.0 <= dVar6];
  if (this->m_type[0] == 5) {
    Internal_EvaluateQuinticBump(this_00,dVar5,dt,der_count,value_01);
  }
  else {
    Internal_EvaluateLinearBump(this_00,dVar5,dt,der_count,value_01);
  }
  value_00 = value_01 + (der_count + 1);
  dVar6 = dVar6 * dt_00;
  if (this->m_type[1] == 5) {
    Internal_EvaluateQuinticBump(this_00,dVar6,dt_00,der_count,value_00);
  }
  else {
    Internal_EvaluateLinearBump(this_00,dVar6,dt_00,der_count,value_00);
  }
  lVar1 = 1;
  for (iVar2 = 0; iVar2 <= der_count; iVar2 = iVar2 + 1) {
    lVar3 = 0;
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      value[lVar4] = this->m_a * *(double *)((long)value_01 + lVar3) * value_00[lVar4];
      lVar3 = lVar3 + -8;
    }
    lVar1 = lVar1 + 1;
    value_01 = value_01 + 1;
    value = (double *)((long)value - lVar3);
  }
  return;
}

Assistant:

void ON_BumpFunction::Evaluate(double s, double t, int der_count, double* value) const
{
  double tmp[20];
  double* xvalue;
  double* yvalue;
  xvalue = ( der_count > 9 ) 
         ? ((double*)onmalloc((der_count+1)*2*sizeof(xvalue[0])))
         : &tmp[0];
  yvalue = xvalue + (der_count+1);
  double x = s-m_x0;
  const double dx = m_sx[x >= 0.0 ? 1 : 0];
  x *= dx;
  double y = t-m_y0;
  const double dy = m_sy[y >= 0.0 ? 1 : 0];
  y *= dy;

  if ( 5 == m_type[0] )
  {
    Internal_EvaluateQuinticBump(x,dx,der_count,xvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(x,dx,der_count,xvalue);
  }
  if ( 5 == m_type[1] )
  {
    Internal_EvaluateQuinticBump(y,dy,der_count,yvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(y,dy,der_count,yvalue);
  }

  int n, i, j;
  for ( n = 0; n <= der_count; n++ )
  {
    for ( i = n, j = 0; j <= n; i--, j++ )
    {
      *value++ = m_a*xvalue[i]*yvalue[j]; // d^nf/(ds^i dt^j)
    }
  }
}